

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O3

void save_load(gdmf *d,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  uint32_t uVar2;
  vw *all;
  _func_void_weight_ptr_void_ptr *p_Var3;
  uint *stride_00;
  ostream *poVar4;
  size_t sVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var6;
  size_t sVar7;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint32_t *puVar8;
  uint uVar9;
  long lVar10;
  weight *data;
  uint64_t i;
  uint64_t index;
  uint32_t stride;
  ulong local_200;
  uint local_1f8;
  uint local_1f4;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1f0;
  vw *local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  gdmf *local_1d0;
  ulong local_1c8;
  float *local_1c0;
  uint local_1b8 [4];
  undefined1 local_1a8 [376];
  
  local_1f8 = (uint)CONCAT71(in_register_00000009,text);
  all = d->all;
  local_1d8 = (ulong)all->num_bits;
  local_1d0 = d;
  if (((int)CONCAT71(in_register_00000011,read) != 0) &&
     (initialize_regressor(all), all->random_weights == true)) {
    bVar1 = (all->weights).sparse;
    puVar8 = &(all->weights).dense_weights._stride_shift;
    if (bVar1 != false) {
      puVar8 = &(all->weights).sparse_weights._stride_shift;
    }
    uVar9 = 1 << ((byte)*puVar8 & 0x1f);
    local_1b8[0] = uVar9;
    if (bVar1 == true) {
      stride_00 = calloc_or_throw<unsigned_int>(1);
      *stride_00 = uVar9;
      (all->weights).sparse_weights.default_data = stride_00;
      (all->weights).sparse_weights.fun = set_rand_wrapper<sparse_parameters>::func;
      set_rand_wrapper<sparse_parameters>::func
                ((all->weights).sparse_weights.default_value,stride_00,0);
    }
    else {
      dense_parameters::set_default<unsigned_int,set_rand_wrapper<dense_parameters>>
                (&(all->weights).dense_weights,local_1b8);
    }
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    local_200 = 0;
    local_1f0 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&(all->weights).sparse_weights;
    local_1f4 = local_1f8 & 0xff;
    local_1e8 = all;
    do {
      while( true ) {
        uVar2 = local_1d0->rank;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        if (read) {
          sVar5 = io_buf::bin_read_fixed(model_file,(char *)&local_200,8,"");
        }
        else {
          sVar5 = bin_text_write_fixed
                            (model_file,(char *)&local_200,8,(stringstream *)local_1b8,
                             SUB41(local_1f4,0));
        }
        if (sVar5 == 0) {
          sVar5 = 0;
        }
        else {
          if ((local_1e8->weights).sparse == true) {
            local_1e0 = local_200 <<
                        ((byte)(local_1e8->weights).sparse_weights._stride_shift & 0x3f) &
                        (local_1e8->weights).sparse_weights._weight_mask;
            _Var6._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_1f0,&local_1e0);
            if (_Var6._M_cur == (__node_type *)0x0) {
              local_1c0 = calloc_or_throw<float>
                                    (1L << ((byte)(local_1e8->weights).sparse_weights._stride_shift
                                           & 0x3f));
              local_1c8 = local_1e0;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,float*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)local_1f0,&local_1c8);
              _Var6._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find(local_1f0,&local_1e0);
              p_Var3 = (local_1e8->weights).sparse_weights.fun;
              if (p_Var3 != (_func_void_weight_ptr_void_ptr *)0x0) {
                (*p_Var3)(*(weight **)((long)_Var6._M_cur + 0x10),
                          (local_1e8->weights).sparse_weights.default_data);
              }
            }
            data = *(weight **)
                    ((long)&((_Var6._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          }
          else {
            data = (local_1e8->weights).dense_weights._begin +
                   (local_200 << ((byte)(local_1e8->weights).dense_weights._stride_shift & 0x3f) &
                   (local_1e8->weights).dense_weights._weight_mask);
          }
          lVar10 = (ulong)(uVar2 * 2) + 1;
          do {
            poVar4 = std::ostream::_M_insert<void_const*>(local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            if (read) {
              sVar7 = io_buf::bin_read_fixed(model_file,(char *)data,4,"");
            }
            else {
              sVar7 = bin_text_write_fixed
                                (model_file,(char *)data,4,(stringstream *)local_1b8,
                                 SUB41(local_1f4,0));
            }
            sVar5 = sVar5 + sVar7;
            data = data + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        if ((char)local_1f8 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          if (read) {
            sVar7 = 0;
          }
          else {
            sVar7 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1b8,true);
          }
          sVar5 = sVar5 + sVar7;
        }
        if (!read) break;
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        if (sVar5 == 0) {
          return;
        }
      }
      local_200 = local_200 + 1;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    } while (local_200 >> ((byte)local_1d8 & 0x3f) == 0);
  }
  return;
}

Assistant:

void save_load(gdmf& d, io_buf& model_file, bool read, bool text)
{
  vw& all = *d.all;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
  {
    initialize_regressor(all);
    if (all.random_weights)
    {
      uint32_t stride = all.weights.stride();
      if (all.weights.sparse)
        all.weights.sparse_weights.set_default<uint32_t, set_rand_wrapper<sparse_parameters> >(stride);
      else
        all.weights.dense_weights.set_default<uint32_t, set_rand_wrapper<dense_parameters> >(stride);
    }
  }

  if (model_file.files.size() > 0)
  {
    uint64_t i = 0;
    size_t brw = 1;
    do
    {
      brw = 0;
      size_t K = d.rank * 2 + 1;
      stringstream msg;
      msg << i << " ";
      brw += bin_text_read_write_fixed(model_file, (char*)&i, sizeof(i), "", read, msg, text);
      if (brw != 0)
      {
        weight* w_i = &(all.weights.strided_index(i));
        for (uint64_t k = 0; k < K; k++)
        {
          weight* v = w_i + k;
          msg << v << " ";
          brw += bin_text_read_write_fixed(model_file, (char*)v, sizeof(*v), "", read, msg, text);
        }
      }
      if (text)
      {
        msg << "\n";
        brw += bin_text_read_write_fixed(model_file, nullptr, 0, "", read, msg, text);
      }

      if (!read)
        ++i;
    } while ((!read && i < length) || (read && brw > 0));
  }
}